

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O3

bool __thiscall QMilankovicCalendar::isLeapYear(QMilankovicCalendar *this,int year)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (uint)(year < 1) + year;
  if ((uVar3 & 3) != 0) {
    return false;
  }
  if ((int)uVar3 < 0) {
    uVar2 = ~uVar3 / 100;
    uVar1 = ~uVar2;
    uVar3 = (uVar2 * 100 - ~uVar3) + 99;
  }
  else {
    uVar1 = uVar3 / 100;
    uVar3 = uVar3 % 100;
  }
  if (uVar3 == 0) {
    if ((int)uVar1 < 0) {
      uVar1 = ((~uVar1 / 9) * 9 - ~uVar1) + 8;
    }
    else {
      uVar1 = uVar1 % 9;
    }
    if ((uVar1 & 0xb) != 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool QMilankovicCalendar::isLeapYear(int year) const
{
    if (year == QCalendar::Unspecified)
        return false;
    if (year <= 0)
        ++year;
    if (qMod<4>(year))
        return false;
    const auto yeardm = qDivMod<100>(year);
    if (yeardm.remainder == 0) {
        const qint16 century = qMod<9>(yeardm.quotient);
        if (century != 2 && century != 6)
            return false;
    }
    return true;
}